

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pubkey.c
# Opt level: O0

int X509_PUBKEY_set0_param
              (X509_PUBKEY *pub,ASN1_OBJECT *aobj,int ptype,void *pval,uchar *penc,int penclen)

{
  int iVar1;
  int local_4;
  
  iVar1 = X509_ALGOR_set0(pub->algor,aobj,ptype,pval);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    if (penc != (uchar *)0x0) {
      CRYPTO_free(pub->public_key->data);
      pub->public_key->data = penc;
      pub->public_key->length = penclen;
      pub->public_key->flags = pub->public_key->flags & 0xfffffffffffffff0;
      pub->public_key->flags = pub->public_key->flags | 8;
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int X509_PUBKEY_set0_param(X509_PUBKEY *pub, ASN1_OBJECT *aobj,
                           int ptype, void *pval,
                           unsigned char *penc, int penclen)
{
    if (!X509_ALGOR_set0(pub->algor, aobj, ptype, pval))
        return 0;
    if (penc) {
        OPENSSL_free(pub->public_key->data);
        pub->public_key->data = penc;
        pub->public_key->length = penclen;
        /* Set number of unused bits to zero */
        pub->public_key->flags &= ~(ASN1_STRING_FLAG_BITS_LEFT | 0x07);
        pub->public_key->flags |= ASN1_STRING_FLAG_BITS_LEFT;
    }
    return 1;
}